

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O3

void __thiscall
llvm::ScopedPrinter::printHex<unsigned_short>
          (ScopedPrinter *this,StringRef Label,unsigned_short Value)

{
  raw_ostream *prVar1;
  undefined6 in_register_0000000a;
  StringRef Str;
  StringRef Str_00;
  HexNumber local_30;
  
  printIndent(this);
  prVar1 = raw_ostream::operator<<(this->OS,Label);
  Str.Length = 2;
  Str.Data = ": ";
  prVar1 = raw_ostream::operator<<(prVar1,Str);
  local_30.Value = CONCAT62(in_register_0000000a,Value) & 0xffffffff;
  prVar1 = llvm::operator<<(prVar1,&local_30);
  Str_00.Length = 1;
  Str_00.Data = "\n";
  raw_ostream::operator<<(prVar1,Str_00);
  return;
}

Assistant:

void printHex(StringRef Label, T Value) {
    startLine() << Label << ": " << hex(Value) << "\n";
  }